

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O2

void __thiscall pg::PPSolver::PPSolver(PPSolver *this,Oink *oink,Game *game)

{
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__PPSolver_0019d630;
  bitset::bitset(&this->Z,game->n_vertices);
  uintqueue::uintqueue(&this->Q,(uint)game->n_vertices);
  return;
}

Assistant:

PPSolver::PPSolver(Oink& oink, Game& game) : Solver(oink, game), Z(game.nodecount()), Q(game.nodecount())
{
}